

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLCh *baseURL,XMLCh *relativeURL,XMLURL *xmlURL)

{
  bool bVar1;
  XMLURL basePart;
  XMLURL XStack_78;
  
  cleanUp(this);
  bVar1 = parse(relativeURL,xmlURL);
  if (bVar1) {
    bVar1 = true;
    if ((this->fProtocol != Unknown) && (this->fPath != (XMLCh *)0x0)) {
      bVar1 = *this->fPath != L'/';
    }
    if (baseURL == (XMLCh *)0x0) {
      return true;
    }
    if (!bVar1) {
      return true;
    }
    if (*baseURL == L'\0') {
      return true;
    }
    XMLURL(&XStack_78,this->fMemoryManager);
    bVar1 = parse(baseURL,&XStack_78);
    if ((bVar1) && (bVar1 = conglomerateWithBase(this,&XStack_78,false), bVar1)) {
      ~XMLURL(&XStack_78);
      return true;
    }
    ~XMLURL(&XStack_78);
  }
  return false;
}

Assistant:

bool XMLURL::setURL(const XMLCh* const    baseURL
                  , const XMLCh* const    relativeURL
                  , XMLURL& xmlURL)
{
    cleanUp();

    // Parse our URL string
    if (parse(relativeURL, xmlURL))
    {
	    //  If its relative and the base is non-null and non-empty, then
	    //  parse the base URL string and conglomerate them.
	    //
	    if (isRelative() && baseURL && *baseURL)
	    {
	        XMLURL basePart(fMemoryManager);
            if (parse(baseURL, basePart)  && conglomerateWithBase(basePart, false))
            {
		        return true;
		    }
	    }
        else
            return true;
    }
    return false;
}